

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

size_t byte_decode(uint8_t *ibuff,size_t isize,uint64_t max,uint64_t *v)

{
  byte *pbVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (max - 1 == 0) {
    sVar3 = 0;
    uVar5 = 1;
  }
  else {
    uVar6 = 0;
    lVar4 = 0;
    sVar3 = 0;
    uVar7 = max - 1;
    do {
      pbVar1 = ibuff + sVar3;
      sVar3 = sVar3 + 1;
      lVar4 = lVar4 + ((ulong)*pbVar1 << (uVar6 & 0x3f));
      uVar6 = uVar6 + 8;
      bVar2 = 0xff < uVar7;
      uVar7 = uVar7 >> 8;
    } while (bVar2);
    uVar5 = lVar4 + 1;
  }
  *v = uVar5;
  return sVar3;
}

Assistant:

size_t byte_decode(
    const uint8_t* ibuff, size_t isize, uint64_t max, uint64_t* v)
{
    size_t ip = 0;
    uint64_t newv = 0;
    int offset = 0;
    max--; /* working here with zero-origin values */
    while (max) {
        // myassert(ip < isize);
        newv += (((uint64_t)ibuff[ip++]) << offset);
        max >>= 8;
        offset += 8;
    }
    *v = newv + 1;
    return ip;
}